

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KeyValuePair.h
# Opt level: O1

void __thiscall
JsUtil::KeyValuePair<Memory::WriteBarrierPtr<void>,_Memory::WriteBarrierPtr<void>_>::KeyValuePair
          (KeyValuePair<Memory::WriteBarrierPtr<void>,_Memory::WriteBarrierPtr<void>_> *this,
          KeyValuePair<Memory::WriteBarrierPtr<void>,_Memory::WriteBarrierPtr<void>_> *other)

{
  void *pvVar1;
  
  pvVar1 = (other->key).ptr;
  Memory::Recycler::WBSetBit((char *)this);
  (this->key).ptr = pvVar1;
  Memory::RecyclerWriteBarrierManager::WriteBarrier(this);
  pvVar1 = (other->value).ptr;
  Memory::Recycler::WBSetBit((char *)&this->value);
  (this->value).ptr = pvVar1;
  Memory::RecyclerWriteBarrierManager::WriteBarrier(&this->value);
  return;
}

Assistant:

KeyValuePair(const KeyValuePair& other)
            : key(other.key), value(other.value)
        {}